

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_busy_timeout(sqlite3 *db,int ms)

{
  int ms_local;
  sqlite3 *db_local;
  
  if (ms < 1) {
    sqlite3_busy_handler(db,(_func_int_void_ptr_int *)0x0,(void *)0x0);
  }
  else {
    sqlite3_busy_handler(db,sqliteDefaultBusyCallback,db);
    db->busyTimeout = ms;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_timeout(sqlite3 *db, int ms){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  if( ms>0 ){
    sqlite3_busy_handler(db, sqliteDefaultBusyCallback, (void*)db);
    db->busyTimeout = ms;
  }else{
    sqlite3_busy_handler(db, 0, 0);
  }
  return SQLITE_OK;
}